

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::WriteAliasedRaw
          (CopyingOutputStreamAdaptor *this,void *data,int size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  LogMessage *other;
  int out_size;
  void *out;
  
  if (size < this->buffer_size_) {
    while( true ) {
      iVar3 = (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[2])
                        (this,&out,&out_size);
      cVar1 = (char)iVar3;
      if (cVar1 == '\0') break;
      if (size <= out_size) {
        memcpy(out,data,(long)size);
        (*(this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[3])
                  (this,(ulong)(uint)(out_size - size));
        return (bool)cVar1;
      }
      memcpy(out,data,(long)out_size);
      data = (void *)((long)data + (long)out_size);
      size = size - out_size;
    }
  }
  else {
    bVar2 = WriteBuffer(this);
    if ((bVar2) &&
       (iVar3 = (*this->copying_stream_->_vptr_CopyingOutputStream[2])
                          (this->copying_stream_,data,(ulong)(uint)size), (char)iVar3 != '\0')) {
      if (this->buffer_used_ != 0) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&out,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl_lite.cc"
                   ,0x15e);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)&out,"CHECK failed: (buffer_used_) == (0): ");
        internal::LogFinisher::operator=((LogFinisher *)&out_size,other);
        internal::LogMessage::~LogMessage((LogMessage *)&out);
      }
      this->position_ = this->position_ + (long)size;
      return true;
    }
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool CopyingOutputStreamAdaptor::WriteAliasedRaw(const void* data, int size) {
  if (size >= buffer_size_) {
    if (!Flush() || !copying_stream_->Write(data, size)) {
      return false;
    }
    GOOGLE_DCHECK_EQ(buffer_used_, 0);
    position_ += size;
    return true;
  }

  void* out;
  int out_size;
  while (true) {
    if (!Next(&out, &out_size)) {
      return false;
    }

    if (size <= out_size) {
      std::memcpy(out, data, size);
      BackUp(out_size - size);
      return true;
    }

    std::memcpy(out, data, out_size);
    data = static_cast<const char*>(data) + out_size;
    size -= out_size;
  }
  return true;
}